

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O1

Packet * __thiscall mognetwork::Packet::operator>>(Packet *this,char *data)

{
  pointer pcVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = this->m_readerPos + 4;
  pcVar1 = (this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar1;
  uVar4 = 0;
  if (uVar3 <= uVar2) {
    uVar4 = *(uint *)(pcVar1 + this->m_readerPos);
    this->m_readerPos = uVar3;
  }
  if ((0 < (int)uVar4) && (this->m_readerPos + uVar4 <= uVar2)) {
    memcpy(data,pcVar1 + this->m_readerPos,(ulong)uVar4);
    data[uVar4] = '\0';
    this->m_readerPos = this->m_readerPos + uVar4;
  }
  return this;
}

Assistant:

Packet& Packet::operator>>(char* data)
  {
    int32_t size = 0;
    *this >> size;

    if (size > 0 && verifySize(size))
      {
	memcpy(data, &((*m_data)[m_readerPos]), size);
	data[size] = '\0';
	m_readerPos += size;
      }
    return (*this);
  }